

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall
HVectorBase<HighsCDouble>::saxpy<double,HighsCDouble>
          (HVectorBase<HighsCDouble> *this,double pivotX,HVectorBase<HighsCDouble> *pivot)

{
  int iVar1;
  pointer pHVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pHVar8;
  uint uVar9;
  double extraout_XMM0_Qa;
  uint uVar10;
  double dVar11;
  HighsCDouble x1;
  HighsCDouble x0;
  HighsCDouble local_88;
  HighsCDouble local_78;
  HVectorBase<HighsCDouble> *local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  double local_48;
  HighsCDouble local_40;
  
  iVar5 = this->count;
  local_60 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  pHVar2 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_58 = (pivot->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar7 = (ulong)(uint)pivot->count;
  local_68 = this;
  local_48 = pivotX;
  if (pivot->count < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = local_50[uVar6];
    pHVar8 = pHVar2 + iVar1;
    local_78.hi = pHVar8->hi;
    local_78.lo = pHVar8->lo;
    local_40 = HighsCDouble::operator*(local_58 + iVar1,local_48);
    local_88 = HighsCDouble::operator+(&local_78,&local_40);
    dVar11 = local_88.lo;
    if ((local_78.hi + local_78.lo == 0.0) && (!NAN(local_78.hi + local_78.lo))) {
      lVar4 = (long)iVar5;
      iVar5 = iVar5 + 1;
      local_60[lVar4] = iVar1;
    }
    pHVar8 = pHVar2 + iVar1;
    abs((int)&local_88);
    uVar3 = (uint)(dVar11 + extraout_XMM0_Qa < 1e-14);
    uVar9 = (int)(uVar3 << 0x1f) >> 0x1f;
    uVar10 = (int)(uVar3 << 0x1f) >> 0x1f;
    *(uint *)&pHVar8->hi = ~uVar9 & local_88.hi._0_4_ | uVar9 & 0x4ad4b81f;
    *(uint *)((long)&pHVar8->hi + 4) = ~uVar10 & local_88.hi._4_4_ | uVar10 & 0x358dee7a;
    *(uint *)&pHVar8->lo = ~((int)(uVar3 << 0x1f) >> 0x1f) & local_88.lo._0_4_;
    *(uint *)((long)&pHVar8->lo + 4) = ~((int)(uVar3 << 0x1f) >> 0x1f) & local_88.lo._4_4_;
  }
  local_68->count = iVar5;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}